

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmConstant *
anon_unknown.dwarf_c91b1::CreateAlloca
          (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,char *suffix,
          bool trackUsers)

{
  uint uVar1;
  uint uniqueId;
  Allocator *allocator;
  SynIdentifier *this;
  VariableData *this_00;
  TypeRef *structType;
  VmConstant *pVVar2;
  ScopeData *local_80;
  VmConstant *value;
  VariableData *variable;
  char *local_60;
  SynIdentifier *local_58;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  ScopeData *scope;
  bool trackUsers_local;
  char *suffix_local;
  TypeBase *type_local;
  SynBase *source_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (module->currentFunction->function == (FunctionData *)0x0) {
    local_80 = ctx->globalScope;
  }
  else {
    local_80 = module->currentFunction->function->functionScope;
  }
  name.end = (char *)local_80;
  uVar1 = ctx->unnamedVariableCount;
  ctx->unnamedVariableCount = uVar1 + 1;
  _nameIdentifier = GetTemporaryName(ctx,uVar1,suffix);
  this = VmModule::get<SynIdentifier>(module);
  variable = (VariableData *)nameIdentifier;
  local_60 = name.begin;
  SynIdentifier::SynIdentifier(this,_nameIdentifier);
  local_58 = this;
  this_00 = VmModule::get<VariableData>(module);
  uVar1 = type->alignment;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData
            (this_00,ctx->allocator,(SynBase *)0x0,(ScopeData *)name.end,uVar1,type,local_58,0,
             uniqueId);
  this_00->isVmAlloca = true;
  this_00->offset = 0xffffffff;
  allocator = module->allocator;
  value = (VmConstant *)this_00;
  structType = ExpressionContext::GetReferenceType(ctx,this_00->type);
  pVVar2 = CreateConstantPointer(allocator,source,0,this_00,&structType->super_TypeBase,trackUsers);
  SmallArray<VariableData_*,_4U>::push_back
            (&module->currentFunction->allocas,(VariableData **)&value);
  return pVVar2;
}

Assistant:

VmConstant* CreateAlloca(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, const char *suffix, bool trackUsers)
	{
		ScopeData *scope = module->currentFunction->function ? module->currentFunction->function->functionScope : ctx.globalScope;

		InplaceStr name = GetTemporaryName(ctx, ctx.unnamedVariableCount++, suffix);

		SynIdentifier *nameIdentifier = new (module->get<SynIdentifier>()) SynIdentifier(name);

		VariableData *variable = new (module->get<VariableData>()) VariableData(ctx.allocator, NULL, scope, type->alignment, type, nameIdentifier, 0, ctx.uniqueVariableId++);

		variable->isVmAlloca = true;
		variable->offset = ~0u;

		VmConstant *value = CreateConstantPointer(module->allocator, source, 0, variable, ctx.GetReferenceType(variable->type), trackUsers);

		module->currentFunction->allocas.push_back(variable);

		return value;
	}